

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::ConstantPaddingLayerParams::MergePartialFromCodedStream
          (ConstantPaddingLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  float *pfVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  unsigned_long uVar8;
  char cVar9;
  ulong uVar10;
  float fVar11;
  pair<unsigned_long,_bool> pVar12;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
LAB_003b92cc:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b92ef;
      input->buffer_ = pbVar2 + 1;
      uVar10 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b92ef:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar10 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar10 = 0x100000000;
      }
      uVar10 = uVar6 | uVar10;
    }
    uVar6 = (uint32)uVar10;
    if ((uVar10 & 0x100000000) == 0) {
LAB_003b9310:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar7 = (uint)(uVar10 >> 3) & 0x1fffffff;
      cVar9 = (char)uVar10;
      if (uVar7 == 3) {
        if (cVar9 != '\x18') goto LAB_003b9310;
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar4, -1 < (long)uVar8)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar12 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar12.first;
          if (((undefined1  [16])pVar12 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->padtogivenoutputsizemode_ = uVar8 != 0;
        goto LAB_003b92cc;
      }
      if (uVar7 != 2) {
        if ((uVar7 != 1) || (cVar9 != '\r')) goto LAB_003b9310;
        pfVar3 = (float *)input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&uStack_38 + 4));
          if (!bVar5) {
            return false;
          }
          fVar11 = uStack_38._4_4_;
        }
        else {
          fVar11 = *pfVar3;
          input->buffer_ = (uint8 *)(pfVar3 + 1);
        }
        this->value_ = fVar11;
        goto LAB_003b92cc;
      }
      if (cVar9 == '\x10') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (1,0x12,input,&this->padamounts_);
      }
      else {
        if ((uVar6 & 0xff) != 0x12) goto LAB_003b9310;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<unsigned_long,(google::protobuf::internal::WireFormatLite::FieldType)4>
                          (input,&this->padamounts_);
      }
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool ConstantPaddingLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.ConstantPaddingLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float value = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &value_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated uint64 padAmounts = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, this->mutable_padamounts())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(16u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 1, 18u, input, this->mutable_padamounts())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool padToGivenOutputSizeMode = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &padtogivenoutputsizemode_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.ConstantPaddingLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.ConstantPaddingLayerParams)
  return false;
#undef DO_
}